

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

mbedtls_ecp_curve_type mbedtls_ecp_get_type(mbedtls_ecp_group *grp)

{
  mbedtls_ecp_curve_type mVar1;
  
  if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
    mVar1 = MBEDTLS_ECP_TYPE_NONE;
  }
  else {
    mVar1 = ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) + MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS;
  }
  return mVar1;
}

Assistant:

mbedtls_ecp_curve_type mbedtls_ecp_get_type(const mbedtls_ecp_group *grp)
{
    if (grp->G.X.p == NULL) {
        return MBEDTLS_ECP_TYPE_NONE;
    }

    if (grp->G.Y.p == NULL) {
        return MBEDTLS_ECP_TYPE_MONTGOMERY;
    } else {
        return MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS;
    }
}